

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

int ggml_backend_sched_backend_id_from_cur(ggml_backend_sched_t sched,ggml_tensor *tensor)

{
  ggml_backend_sched_t sched_00;
  _Bool _Var1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  long in_RSI;
  long in_RDI;
  int b;
  int src_backend_id;
  ggml_tensor *src;
  int i;
  ggml_backend_buffer_t buffer;
  int cur_backend_id;
  ggml_tensor *in_stack_ffffffffffffffa8;
  ggml_backend_t in_stack_ffffffffffffffb0;
  ggml_tensor *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar6;
  undefined4 in_stack_ffffffffffffffc4;
  ggml_backend_sched_t in_stack_ffffffffffffffc8;
  int local_2c;
  int local_4;
  
  local_4 = ggml_backend_sched_backend_from_buffer
                      (in_stack_ffffffffffffffc8,
                       (ggml_tensor *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
  if ((local_4 == -1) &&
     ((*(long *)(in_RSI + 0xe8) == 0 ||
      (local_4 = ggml_backend_sched_backend_from_buffer
                           (in_stack_ffffffffffffffc8,
                            (ggml_tensor *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8), local_4 == -1)))) {
    if ((*(long *)(in_RSI + 8) != 0) ||
       ((*(long *)(in_RSI + 0xe8) != 0 && (*(long *)(*(long *)(in_RSI + 0xe8) + 8) != 0)))) {
      lVar3 = in_RSI + 0x100;
      pcVar4 = ggml_backend_buffer_name((ggml_backend_buffer_t)0x163fdb);
      pcVar5 = ggml_op_name(*(ggml_op *)(in_RSI + 0x50));
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
                 ,0x2ec,
                 "pre-allocated tensor (%s) in a buffer (%s) that cannot run the operation (%s)",
                 lVar3,pcVar4,pcVar5);
    }
    if ((*(uint *)(in_RSI + 0x94) & 1) == 0) {
      for (local_2c = 0; local_2c < 10; local_2c = local_2c + 1) {
        sched_00 = *(ggml_backend_sched_t *)(in_RSI + 0x98 + (long)local_2c * 8);
        if ((((sched_00 != (ggml_backend_sched_t)0x0) && (*(int *)(in_RSI + 0x50) != 0x2d)) &&
            (sched_00->backends[0] != (ggml_backend_t)0x0)) &&
           (*(int *)&(sched_00->backends[0]->iface).event_record == 1)) {
          iVar2 = ggml_backend_sched_backend_from_buffer
                            (sched_00,(ggml_tensor *)
                                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             in_stack_ffffffffffffffb8);
          if (iVar2 != *(int *)(in_RDI + 4) + -1) {
            return iVar2;
          }
          _Var1 = ggml_backend_buffer_is_host((ggml_backend_buffer_t)0x1640e4);
          if (!_Var1) {
            return iVar2;
          }
          iVar6 = 0;
          while( true ) {
            if (iVar2 <= iVar6) {
              return iVar2;
            }
            _Var1 = ggml_backend_supports_op(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
            if ((_Var1) &&
               (_Var1 = ggml_backend_offload_op(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
               , _Var1)) break;
            iVar6 = iVar6 + 1;
          }
          return iVar6;
        }
      }
      local_4 = -1;
    }
    else {
      local_4 = *(int *)(in_RDI + 4) + -1;
    }
  }
  return local_4;
}

Assistant:

static int ggml_backend_sched_backend_id_from_cur(ggml_backend_sched_t sched, struct ggml_tensor * tensor) {
    // assign pre-allocated nodes to their backend
    int cur_backend_id = ggml_backend_sched_backend_from_buffer(sched, tensor, tensor);
    if (cur_backend_id != -1) {
        SET_CAUSE(tensor, "1.dst");
        return cur_backend_id;
    }

    // view_src
    if (tensor->view_src != NULL) {
        cur_backend_id = ggml_backend_sched_backend_from_buffer(sched, tensor->view_src, tensor);
        if (cur_backend_id != -1) {
            SET_CAUSE(tensor, "1.vsrc");
            return cur_backend_id;
        }
    }

    if (tensor->buffer || (tensor->view_src && tensor->view_src->buffer)) {
        // since the tensor is pre-allocated, it cannot be moved to another backend
        ggml_backend_buffer_t buffer = tensor->view_src ? tensor->view_src->buffer : tensor->buffer;
        GGML_ABORT("pre-allocated tensor (%s) in a buffer (%s) that cannot run the operation (%s)", tensor->name, ggml_backend_buffer_name(buffer), ggml_op_name(tensor->op));
    }

    // graph input
    if (tensor->flags & GGML_TENSOR_FLAG_INPUT) {
        cur_backend_id = sched->n_backends - 1; // last backend (assumed CPU)
        SET_CAUSE(tensor, "1.inp");
        return cur_backend_id;
    }

    // operations with weights are preferably run on the same backend as the weights
    for (int i = 0; i < GGML_MAX_SRC; i++) {
        const struct ggml_tensor * src = tensor->src[i];
        if (src == NULL) {
            continue;
        }
        // skip ROPE since the rope freqs tensor is too small to choose a backend based on it
        // not an ideal solution
        if (tensor->op != GGML_OP_ROPE && src->buffer != NULL && src->buffer->usage == GGML_BACKEND_BUFFER_USAGE_WEIGHTS) {
            int src_backend_id = ggml_backend_sched_backend_from_buffer(sched, src, tensor);
            // check if a backend with higher prio wants to offload the op
            if (src_backend_id == sched->n_backends - 1 && ggml_backend_buffer_is_host(src->buffer)) {
                for (int b = 0; b < src_backend_id; b++) {
                    if (ggml_backend_supports_op(sched->backends[b], tensor) && ggml_backend_offload_op(sched->backends[b], tensor)) {
                        SET_CAUSE(tensor, "1.off");
                        return b;
                    }
                }
            }
            SET_CAUSE(tensor, "1.wgt%d", i);
            return src_backend_id;
        }
    }

    return -1;
}